

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

string * fs_win32_to_narrow_abi_cxx11_(string *__return_storage_ptr__,wstring_view w)

{
  error_code eVar1;
  string_view local_60;
  string_view local_50;
  int local_40;
  undefined4 uStack_3c;
  error_category *local_38;
  undefined1 local_30 [8];
  error_code ec;
  wstring_view w_local;
  
  ec._M_cat = (error_category *)w._M_len;
  std::error_code::error_code((error_code *)local_30);
  eVar1 = std::make_error_code(function_not_supported);
  local_38 = eVar1._M_cat;
  local_40 = eVar1._M_value;
  local_30._4_4_ = uStack_3c;
  local_30._0_4_ = local_40;
  ec._0_8_ = local_38;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"fs_win32_to_narrow");
  fs_print_error(local_50,local_60,(error_code *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_win32_to_narrow(FFS_MAYBE_UNUSED std::wstring_view w)
{
  std::error_code ec;

#if defined(_WIN32)
  if (int L = WideCharToMultiByte(CP_UTF8, 0, w.data(), -1, nullptr, 0, nullptr, nullptr); L > 0)  FFS_LIKELY
  {
    std::string buf(L, '\0');
    if(WideCharToMultiByte(CP_UTF8, 0, w.data(), -1, buf.data(), L, nullptr, nullptr) > 0)  FFS_LIKELY
    {
      buf.resize(L-1);  // discard null terminator
      return buf;
    }
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error("", __func__, ec);
  return {};
}